

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

int utf8ncasecmp(void *src1,void *src2,size_t n)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  uchar *s2;
  uchar *s1;
  byte bVar4;
  
  sVar2 = 0;
  while( true ) {
    bVar4 = *(byte *)((long)src1 + sVar2);
    if (((bVar4 == 0) && (*(char *)((long)src2 + sVar2) == '\0')) || (n == sVar2)) {
      return 0;
    }
    bVar1 = *(byte *)((long)src2 + sVar2);
    bVar3 = bVar4 | 0x20;
    if (0x19 < (byte)(bVar4 + 0xbf)) {
      bVar3 = bVar4;
    }
    bVar4 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar4 = bVar1;
    }
    if (bVar3 < bVar4) break;
    if (bVar3 >= bVar4 && bVar3 != bVar4) {
      return 1;
    }
    sVar2 = sVar2 + 1;
  }
  return -1;
}

Assistant:

int utf8ncasecmp(const void *src1, const void *src2, size_t n) {
  const unsigned char *s1 = (const unsigned char *)src1;
  const unsigned char *s2 = (const unsigned char *)src2;

  while ((('\0' != *s1) || ('\0' != *s2)) && (0 != n--)) {
    unsigned char a = *s1;
    unsigned char b = *s2;

    if (('A' <= a) && ('Z' >= a)) {
      a |= 0x20; // make a lowercase
    }

    if (('A' <= b) && ('Z' >= b)) {
      b |= 0x20; // make b lowercase
    }

    if (a < b) {
      return -1;
    } else if (a > b) {
      return 1;
    }

    s1++;
    s2++;
  }

  // both utf8 strings matched
  return 0;
}